

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

aiVector3D __thiscall Assimp::XFileParser::ReadVector3(XFileParser *this)

{
  ai_real aVar1;
  ai_real aVar2;
  aiVector3D aVar3;
  
  aVar3.x = ReadFloat(this);
  aVar1 = ReadFloat(this);
  aVar2 = ReadFloat(this);
  TestForSeparator(this);
  aVar3.y = aVar1;
  aVar3.z = aVar2;
  return aVar3;
}

Assistant:

aiVector3D XFileParser::ReadVector3()
{
    aiVector3D vector;
    vector.x = ReadFloat();
    vector.y = ReadFloat();
    vector.z = ReadFloat();
    TestForSeparator();

    return vector;
}